

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O2

CBlockLocator * GetLocator(CBlockLocator *__return_storage_ptr__,Chain *chain,uint256 *block_hash)

{
  uint __line;
  int iVar1;
  char *__assertion;
  long in_FS_OFFSET;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  CBlockLocator *local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->vHave).super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->vHave).super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->vHave).super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uStack_30 = 0;
  local_28 = 0;
  uStack_20 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_38 = __return_storage_ptr__;
  iVar1 = (*chain->_vptr_Chain[10])(chain,block_hash,&local_68);
  if ((char)iVar1 == '\0') {
    __assertion = "found";
    __line = 0x29;
  }
  else {
    if ((__return_storage_ptr__->vHave).super__Vector_base<uint256,_std::allocator<uint256>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        (__return_storage_ptr__->vHave).super__Vector_base<uint256,_std::allocator<uint256>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        return __return_storage_ptr__;
      }
      __stack_chk_fail();
    }
    __assertion = "!locator.IsNull()";
    __line = 0x2a;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/index/base.cpp"
                ,__line,"CBlockLocator GetLocator(interfaces::Chain &, const uint256 &)");
}

Assistant:

CBlockLocator GetLocator(interfaces::Chain& chain, const uint256& block_hash)
{
    CBlockLocator locator;
    bool found = chain.findBlock(block_hash, interfaces::FoundBlock().locator(locator));
    assert(found);
    assert(!locator.IsNull());
    return locator;
}